

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O0

uLong adler32_combine_(uLong adler1,uLong adler2,long len2)

{
  ulong uStack_38;
  uint rem;
  unsigned_long sum2;
  unsigned_long sum1;
  long len2_local;
  uLong adler2_local;
  uLong adler1_local;
  
  if (len2 < 0) {
    adler1_local = 0xffffffff;
  }
  else {
    sum2 = (adler2 & 0xffff) + 0xfff0 + (adler1 & 0xffff);
    uStack_38 = (((adler1 >> 0x10 & 0xffff) + (adler2 >> 0x10 & 0xffff) + 0xfff1) -
                (len2 % 0xfff1 & 0xffffffffU)) +
                ((len2 % 0xfff1 & 0xffffffffU) * (adler1 & 0xffff)) % 0xfff1;
    if (0xfff0 < sum2) {
      sum2 = sum2 - 0xfff1;
    }
    if (0xfff0 < sum2) {
      sum2 = sum2 - 0xfff1;
    }
    if (0x1ffe1 < uStack_38) {
      uStack_38 = uStack_38 - 0x1ffe2;
    }
    if (0xfff0 < uStack_38) {
      uStack_38 = uStack_38 - 0xfff1;
    }
    adler1_local = sum2 | uStack_38 << 0x10;
  }
  return adler1_local;
}

Assistant:

local uLong adler32_combine_(adler1, adler2, len2)
    uLong adler1;
    uLong adler2;
    z_off64_t len2;
{
    unsigned long sum1;
    unsigned long sum2;
    unsigned rem;

    /* for negative len, return invalid adler32 as a clue for debugging */
    if (len2 < 0)
        return 0xffffffffUL;

    /* the derivation of this formula is left as an exercise for the reader */
    MOD63(len2);                /* assumes len2 >= 0 */
    rem = (unsigned)len2;
    sum1 = adler1 & 0xffff;
    sum2 = rem * sum1;
    MOD(sum2);
    sum1 += (adler2 & 0xffff) + BASE - 1;
    sum2 += ((adler1 >> 16) & 0xffff) + ((adler2 >> 16) & 0xffff) + BASE - rem;
    if (sum1 >= BASE) sum1 -= BASE;
    if (sum1 >= BASE) sum1 -= BASE;
    if (sum2 >= ((unsigned long)BASE << 1)) sum2 -= ((unsigned long)BASE << 1);
    if (sum2 >= BASE) sum2 -= BASE;
    return sum1 | (sum2 << 16);
}